

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_flags nk_convert(nk_context *ctx,nk_buffer *cmds,nk_buffer *vertices,nk_buffer *elements,
                   nk_convert_config *config)

{
  nk_draw_list *list;
  ushort uVar1;
  nk_vec2 nVar2;
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_vec2 a;
  nk_vec2 a_00;
  nk_vec2 pos_01;
  nk_vec2 center;
  nk_vec2 pos_02;
  nk_vec2 center_00;
  nk_vec2 center_01;
  nk_vec2 center_02;
  nk_vec2 p0;
  nk_vec2 a_01;
  nk_vec2 b;
  nk_vec2 b_00;
  nk_vec2 cp0;
  nk_vec2 b_01;
  nk_vec2 c;
  nk_vec2 c_00;
  nk_vec2 cp1;
  nk_vec2 p1;
  nk_handle nVar3;
  nk_draw_vertex_layout_element *pnVar4;
  nk_size nVar5;
  nk_size nVar6;
  nk_anti_aliasing nVar7;
  nk_anti_aliasing nVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  nk_anti_aliasing nVar12;
  nk_anti_aliasing nVar13;
  nk_command *pnVar14;
  nk_draw_list_stroke closed;
  nk_command_scissor *s;
  nk_color nVar15;
  ulong uVar16;
  float fVar17;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect rect_03;
  nk_rect rect_04;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2844,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (cmds == (nk_buffer *)0x0) {
    __assert_fail("cmds",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2845,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (vertices == (nk_buffer *)0x0) {
    __assert_fail("vertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2846,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (elements == (nk_buffer *)0x0) {
    __assert_fail("elements",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2847,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (config == (nk_convert_config *)0x0) {
    __assert_fail("config",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2848,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (config->vertex_layout == (nk_draw_vertex_layout_element *)0x0) {
    __assert_fail("config->vertex_layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2849,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (config->vertex_size == 0) {
    __assert_fail("config->vertex_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x284a,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  nVar12 = config->line_AA;
  nVar13 = config->shape_AA;
  (ctx->draw_list).buffer = cmds;
  nVar7 = config->line_AA;
  nVar8 = config->shape_AA;
  uVar9 = config->circle_segment_count;
  uVar10 = config->arc_segment_count;
  uVar11 = config->curve_segment_count;
  nVar3 = (config->null).texture;
  nVar2 = (config->null).uv;
  pnVar4 = config->vertex_layout;
  nVar5 = config->vertex_size;
  nVar6 = config->vertex_alignment;
  (ctx->draw_list).config.global_alpha = config->global_alpha;
  (ctx->draw_list).config.line_AA = nVar7;
  (ctx->draw_list).config.shape_AA = nVar8;
  (ctx->draw_list).config.circle_segment_count = uVar9;
  (ctx->draw_list).config.arc_segment_count = uVar10;
  (ctx->draw_list).config.curve_segment_count = uVar11;
  (ctx->draw_list).config.null.texture = nVar3;
  (ctx->draw_list).config.null.uv = nVar2;
  (ctx->draw_list).config.vertex_layout = pnVar4;
  (ctx->draw_list).config.vertex_size = nVar5;
  (ctx->draw_list).config.vertex_alignment = nVar6;
  (ctx->draw_list).elements = elements;
  (ctx->draw_list).vertices = vertices;
  (ctx->draw_list).line_AA = nVar12;
  (ctx->draw_list).shape_AA = nVar13;
  (ctx->draw_list).clip_rect = nk_null_rect;
  (ctx->draw_list).cmd_offset = 0;
  (ctx->draw_list).element_count = 0;
  (ctx->draw_list).vertex_count = 0;
  (ctx->draw_list).cmd_count = 0;
  (ctx->draw_list).path_count = 0;
  pnVar14 = nk__begin(ctx);
  if (pnVar14 != (nk_command *)0x0) {
    list = &ctx->draw_list;
    do {
      switch(pnVar14->type) {
      case NK_COMMAND_SCISSOR:
        rect.x = (float)(int)(short)pnVar14[1].type;
        rect.w = (float)*(ushort *)&pnVar14[1].field_0x4;
        rect.y = (float)(int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2);
        rect.h = (float)*(ushort *)&pnVar14[1].field_0x6;
        nk_draw_list_add_clip(list,rect);
        break;
      case NK_COMMAND_LINE:
        a_01.y = (float)(int)*(short *)&pnVar14[1].field_0x4;
        a_01.x = (float)(int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2);
        b_01.y = (float)(int)(short)pnVar14[1].next;
        b_01.x = (float)(int)*(short *)&pnVar14[1].field_0x6;
        nk_draw_list_stroke_line
                  (list,a_01,b_01,*(nk_color *)((long)&pnVar14[1].next + 2),
                   (float)(ushort)(short)pnVar14[1].type);
        break;
      case NK_COMMAND_CURVE:
        p0.y = (float)(int)*(short *)&pnVar14[1].field_0x4;
        p0.x = (float)(int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2);
        cp0.y = (float)(int)*(short *)((long)&pnVar14[1].next + 4);
        cp0.x = (float)(int)*(short *)((long)&pnVar14[1].next + 2);
        cp1.y = (float)(int)(short)pnVar14[2].type;
        cp1.x = (float)(int)*(short *)((long)&pnVar14[1].next + 6);
        p1.y = (float)(int)(short)pnVar14[1].next;
        p1.x = (float)(int)*(short *)&pnVar14[1].field_0x6;
        nk_draw_list_stroke_curve
                  (list,p0,cp0,cp1,p1,*(nk_color *)((long)&pnVar14[2].type + 2),
                   config->curve_segment_count,(float)(ushort)(short)pnVar14[1].type);
        break;
      case NK_COMMAND_RECT:
        rect_03.x = (float)(int)*(short *)&pnVar14[1].field_0x4;
        rect_03.w = (float)(ushort)pnVar14[1].next;
        rect_03.y = (float)(int)*(short *)&pnVar14[1].field_0x6;
        rect_03.h = (float)*(ushort *)((long)&pnVar14[1].next + 2);
        nk_draw_list_stroke_rect
                  (list,rect_03,*(nk_color *)((long)&pnVar14[1].next + 4),
                   (float)(ushort)(short)pnVar14[1].type,
                   (float)(ushort)*(undefined2 *)((long)&pnVar14[1].type + 2));
        break;
      case NK_COMMAND_RECT_FILLED:
        rect_01.x = (float)(int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2);
        rect_01.w = (float)*(ushort *)&pnVar14[1].field_0x6;
        rect_01.y = (float)(int)*(short *)&pnVar14[1].field_0x4;
        rect_01.h = (float)(ushort)pnVar14[1].next;
        nk_draw_list_fill_rect
                  (list,rect_01,*(nk_color *)((long)&pnVar14[1].next + 2),
                   (float)(ushort)(short)pnVar14[1].type);
        break;
      case NK_COMMAND_RECT_MULTI_COLOR:
        rect_04.x = (float)(int)(short)pnVar14[1].type;
        rect_04.w = (float)*(ushort *)&pnVar14[1].field_0x4;
        nVar15.r = pnVar14[2].field_0x4;
        nVar15.g = pnVar14[2].field_0x5;
        nVar15.b = pnVar14[2].field_0x6;
        nVar15.a = pnVar14[2].field_0x7;
        rect_04.y = (float)(int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2);
        rect_04.h = (float)*(ushort *)&pnVar14[1].field_0x6;
        nk_draw_list_fill_rect_multi_color
                  (list,rect_04,*(nk_color *)&pnVar14[1].next,
                   *(nk_color *)((long)&pnVar14[1].next + 4),nVar15,(nk_color)pnVar14[2].type);
        break;
      case NK_COMMAND_CIRCLE:
        fVar17 = (float)*(ushort *)&pnVar14[1].field_0x6 * 0.5;
        center_02.y = (float)(ushort)pnVar14[1].next * 0.5 +
                      (float)(int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2);
        center_02.x = (float)(int)(short)pnVar14[1].type + fVar17;
        nk_draw_list_stroke_circle
                  (list,center_02,fVar17,*(nk_color *)((long)&pnVar14[1].next + 2),
                   config->circle_segment_count,(float)*(ushort *)&pnVar14[1].field_0x4);
        break;
      case NK_COMMAND_CIRCLE_FILLED:
        fVar17 = (float)*(ushort *)&pnVar14[1].field_0x4 * 0.5;
        center_01.y = (float)*(ushort *)&pnVar14[1].field_0x6 * 0.5 +
                      (float)(int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2);
        center_01.x = (float)(int)(short)pnVar14[1].type + fVar17;
        nk_draw_list_fill_circle
                  (list,center_01,fVar17,*(nk_color *)&pnVar14[1].next,config->circle_segment_count)
        ;
        break;
      case NK_COMMAND_ARC:
        pos_02.y = (float)(int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2);
        pos_02.x = (float)(int)(short)pnVar14[1].type;
        nk_draw_list_path_line_to(list,pos_02);
        center_00.y = (float)(int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2);
        center_00.x = (float)(int)(short)pnVar14[1].type;
        nk_draw_list_path_arc_to
                  (list,center_00,(float)*(ushort *)&pnVar14[1].field_0x4,*(float *)&pnVar14[1].next
                   ,*(float *)((long)&pnVar14[1].next + 4),config->arc_segment_count);
        uVar1 = *(ushort *)&pnVar14[1].field_0x6;
        nVar15 = (nk_color)pnVar14[2].type;
        goto LAB_00123f66;
      case NK_COMMAND_ARC_FILLED:
        pos_01.y = (float)(int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2);
        pos_01.x = (float)(int)(short)pnVar14[1].type;
        nk_draw_list_path_line_to(list,pos_01);
        center.y = (float)(int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2);
        center.x = (float)(int)(short)pnVar14[1].type;
        nk_draw_list_path_arc_to
                  (list,center,(float)*(ushort *)&pnVar14[1].field_0x4,*(float *)&pnVar14[1].next,
                   *(float *)((long)&pnVar14[1].next + 4),config->arc_segment_count);
        nVar15 = (nk_color)pnVar14[2].type;
        goto LAB_00123e25;
      case NK_COMMAND_TRIANGLE:
        a_00.y = (float)(int)*(short *)&pnVar14[1].field_0x4;
        a_00.x = (float)(int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2);
        b_00.y = (float)(int)(short)pnVar14[1].next;
        b_00.x = (float)(int)*(short *)&pnVar14[1].field_0x6;
        c_00.y = (float)(int)*(short *)((long)&pnVar14[1].next + 4);
        c_00.x = (float)(int)*(short *)((long)&pnVar14[1].next + 2);
        nk_draw_list_stroke_triangle
                  (list,a_00,b_00,c_00,*(nk_color *)((long)&pnVar14[1].next + 6),
                   (float)(ushort)(short)pnVar14[1].type);
        break;
      case NK_COMMAND_TRIANGLE_FILLED:
        a.y = (float)(int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2);
        a.x = (float)(int)(short)pnVar14[1].type;
        b.y = (float)(int)*(short *)&pnVar14[1].field_0x6;
        b.x = (float)(int)*(short *)&pnVar14[1].field_0x4;
        c.y = (float)(int)*(short *)((long)&pnVar14[1].next + 2);
        c.x = (float)(int)(short)pnVar14[1].next;
        nk_draw_list_fill_triangle(list,a,b,c,*(nk_color *)((long)&pnVar14[1].next + 4));
        break;
      case NK_COMMAND_POLYGON:
        if (*(short *)&pnVar14[1].field_0x6 != 0) {
          uVar16 = 0;
          do {
            pos_00.y = (float)(int)*(short *)((long)&pnVar14[1].next + uVar16 * 4 + 2);
            pos_00.x = (float)(int)*(short *)((long)&pnVar14[1].next + uVar16 * 4);
            nk_draw_list_path_line_to(list,pos_00);
            uVar16 = uVar16 + 1;
          } while (uVar16 < *(ushort *)&pnVar14[1].field_0x6);
        }
        uVar1 = *(ushort *)&pnVar14[1].field_0x4;
        nVar15 = (nk_color)pnVar14[1].type;
LAB_00123f66:
        closed = NK_STROKE_CLOSED;
LAB_00123f6e:
        nk_draw_list_path_stroke(list,nVar15,closed,(float)uVar1);
        break;
      case NK_COMMAND_POLYGON_FILLED:
        if (*(short *)&pnVar14[1].field_0x4 != 0) {
          uVar16 = 0;
          do {
            pos.y = (float)(int)*(short *)((long)&pnVar14[1].next + uVar16 * 4);
            pos.x = (float)(int)*(short *)(&pnVar14[1].field_0x6 + uVar16 * 4);
            nk_draw_list_path_line_to(list,pos);
            uVar16 = uVar16 + 1;
          } while (uVar16 < *(ushort *)&pnVar14[1].field_0x4);
        }
        nVar15 = (nk_color)pnVar14[1].type;
LAB_00123e25:
        nk_draw_list_path_fill(list,nVar15);
        break;
      case NK_COMMAND_POLYLINE:
        if (*(short *)&pnVar14[1].field_0x6 != 0) {
          uVar16 = 0;
          do {
            nVar2.y = (float)(int)*(short *)((long)&pnVar14[1].next + uVar16 * 4 + 2);
            nVar2.x = (float)(int)*(short *)((long)&pnVar14[1].next + uVar16 * 4);
            nk_draw_list_path_line_to(list,nVar2);
            uVar16 = uVar16 + 1;
          } while (uVar16 < *(ushort *)&pnVar14[1].field_0x6);
        }
        uVar1 = *(ushort *)&pnVar14[1].field_0x4;
        nVar15 = (nk_color)pnVar14[1].type;
        closed = NK_STROKE_OPEN;
        goto LAB_00123f6e;
      case NK_COMMAND_TEXT:
        rect_02.x = (float)(int)(short)pnVar14[2].type;
        rect_02.w = (float)*(ushort *)&pnVar14[2].field_0x4;
        rect_02.y = (float)(int)(short)*(undefined2 *)((long)&pnVar14[2].type + 2);
        rect_02.h = (float)*(ushort *)&pnVar14[2].field_0x6;
        nk_draw_list_add_text
                  (list,*(nk_user_font **)(pnVar14 + 1),rect_02,(char *)(pnVar14 + 3),
                   *(int *)((long)&pnVar14[2].next + 4),*(float *)&pnVar14[2].next,
                   *(nk_color *)((long)&pnVar14[1].next + 4));
        break;
      case NK_COMMAND_IMAGE:
        rect_00.x = (float)(int)(short)pnVar14[1].type;
        rect_00.w = (float)*(ushort *)&pnVar14[1].field_0x4;
        rect_00.y = (float)(int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2);
        rect_00.h = (float)*(ushort *)&pnVar14[1].field_0x6;
        nk_draw_list_add_image(list,*(nk_image *)&pnVar14[1].next,rect_00,(nk_color)pnVar14[3].type)
        ;
        break;
      case NK_COMMAND_CUSTOM:
        (**(code **)(pnVar14 + 2))
                  (list,(int)(short)pnVar14[1].type,
                   (int)(short)*(undefined2 *)((long)&pnVar14[1].type + 2),
                   *(undefined2 *)&pnVar14[1].field_0x4,*(undefined2 *)&pnVar14[1].field_0x6,
                   pnVar14[1].next);
      }
      if ((ctx->count == 0) || ((ctx->memory).allocated <= pnVar14->next)) {
        pnVar14 = (nk_command *)0x0;
      }
      else {
        pnVar14 = (nk_command *)(pnVar14->next + (long)(ctx->memory).memory.ptr);
      }
    } while (pnVar14 != (nk_command *)0x0);
  }
  return (uint)(vertices->allocated < vertices->needed) * 4 +
         (uint)(((cmds->memory).size + cmds->allocated) - cmds->size < cmds->needed) * 2 +
         (uint)(elements->allocated < elements->needed) * 8;
}

Assistant:

NK_API nk_flags
nk_convert(struct nk_context *ctx, struct nk_buffer *cmds,
    struct nk_buffer *vertices, struct nk_buffer *elements,
    const struct nk_convert_config *config)
{
    nk_flags res = NK_CONVERT_SUCCESS;
    const struct nk_command *cmd;
    NK_ASSERT(ctx);
    NK_ASSERT(cmds);
    NK_ASSERT(vertices);
    NK_ASSERT(elements);
    NK_ASSERT(config);
    NK_ASSERT(config->vertex_layout);
    NK_ASSERT(config->vertex_size);
    if (!ctx || !cmds || !vertices || !elements || !config || !config->vertex_layout)
        return NK_CONVERT_INVALID_PARAM;

    nk_draw_list_setup(&ctx->draw_list, config, cmds, vertices, elements,
        config->line_AA, config->shape_AA);
    nk_foreach(cmd, ctx)
    {
#ifdef NK_INCLUDE_COMMAND_USERDATA
        ctx->draw_list.userdata = cmd->userdata;
#endif
        switch (cmd->type) {
        case NK_COMMAND_NOP: break;
        case NK_COMMAND_SCISSOR: {
            const struct nk_command_scissor *s = (const struct nk_command_scissor*)cmd;
            nk_draw_list_add_clip(&ctx->draw_list, nk_rect(s->x, s->y, s->w, s->h));
        } break;
        case NK_COMMAND_LINE: {
            const struct nk_command_line *l = (const struct nk_command_line*)cmd;
            nk_draw_list_stroke_line(&ctx->draw_list, nk_vec2(l->begin.x, l->begin.y),
                nk_vec2(l->end.x, l->end.y), l->color, l->line_thickness);
        } break;
        case NK_COMMAND_CURVE: {
            const struct nk_command_curve *q = (const struct nk_command_curve*)cmd;
            nk_draw_list_stroke_curve(&ctx->draw_list, nk_vec2(q->begin.x, q->begin.y),
                nk_vec2(q->ctrl[0].x, q->ctrl[0].y), nk_vec2(q->ctrl[1].x,
                q->ctrl[1].y), nk_vec2(q->end.x, q->end.y), q->color,
                config->curve_segment_count, q->line_thickness);
        } break;
        case NK_COMMAND_RECT: {
            const struct nk_command_rect *r = (const struct nk_command_rect*)cmd;
            nk_draw_list_stroke_rect(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
                r->color, (float)r->rounding, r->line_thickness);
        } break;
        case NK_COMMAND_RECT_FILLED: {
            const struct nk_command_rect_filled *r = (const struct nk_command_rect_filled*)cmd;
            nk_draw_list_fill_rect(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
                r->color, (float)r->rounding);
        } break;
        case NK_COMMAND_RECT_MULTI_COLOR: {
            const struct nk_command_rect_multi_color *r = (const struct nk_command_rect_multi_color*)cmd;
            nk_draw_list_fill_rect_multi_color(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
                r->left, r->top, r->right, r->bottom);
        } break;
        case NK_COMMAND_CIRCLE: {
            const struct nk_command_circle *c = (const struct nk_command_circle*)cmd;
            nk_draw_list_stroke_circle(&ctx->draw_list, nk_vec2((float)c->x + (float)c->w/2,
                (float)c->y + (float)c->h/2), (float)c->w/2, c->color,
                config->circle_segment_count, c->line_thickness);
        } break;
        case NK_COMMAND_CIRCLE_FILLED: {
            const struct nk_command_circle_filled *c = (const struct nk_command_circle_filled *)cmd;
            nk_draw_list_fill_circle(&ctx->draw_list, nk_vec2((float)c->x + (float)c->w/2,
                (float)c->y + (float)c->h/2), (float)c->w/2, c->color,
                config->circle_segment_count);
        } break;
        case NK_COMMAND_ARC: {
            const struct nk_command_arc *c = (const struct nk_command_arc*)cmd;
            nk_draw_list_path_line_to(&ctx->draw_list, nk_vec2(c->cx, c->cy));
            nk_draw_list_path_arc_to(&ctx->draw_list, nk_vec2(c->cx, c->cy), c->r,
                c->a[0], c->a[1], config->arc_segment_count);
            nk_draw_list_path_stroke(&ctx->draw_list, c->color, NK_STROKE_CLOSED, c->line_thickness);
        } break;
        case NK_COMMAND_ARC_FILLED: {
            const struct nk_command_arc_filled *c = (const struct nk_command_arc_filled*)cmd;
            nk_draw_list_path_line_to(&ctx->draw_list, nk_vec2(c->cx, c->cy));
            nk_draw_list_path_arc_to(&ctx->draw_list, nk_vec2(c->cx, c->cy), c->r,
                c->a[0], c->a[1], config->arc_segment_count);
            nk_draw_list_path_fill(&ctx->draw_list, c->color);
        } break;
        case NK_COMMAND_TRIANGLE: {
            const struct nk_command_triangle *t = (const struct nk_command_triangle*)cmd;
            nk_draw_list_stroke_triangle(&ctx->draw_list, nk_vec2(t->a.x, t->a.y),
                nk_vec2(t->b.x, t->b.y), nk_vec2(t->c.x, t->c.y), t->color,
                t->line_thickness);
        } break;
        case NK_COMMAND_TRIANGLE_FILLED: {
            const struct nk_command_triangle_filled *t = (const struct nk_command_triangle_filled*)cmd;
            nk_draw_list_fill_triangle(&ctx->draw_list, nk_vec2(t->a.x, t->a.y),
                nk_vec2(t->b.x, t->b.y), nk_vec2(t->c.x, t->c.y), t->color);
        } break;
        case NK_COMMAND_POLYGON: {
            int i;
            const struct nk_command_polygon*p = (const struct nk_command_polygon*)cmd;
            for (i = 0; i < p->point_count; ++i) {
                struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
                nk_draw_list_path_line_to(&ctx->draw_list, pnt);
            }
            nk_draw_list_path_stroke(&ctx->draw_list, p->color, NK_STROKE_CLOSED, p->line_thickness);
        } break;
        case NK_COMMAND_POLYGON_FILLED: {
            int i;
            const struct nk_command_polygon_filled *p = (const struct nk_command_polygon_filled*)cmd;
            for (i = 0; i < p->point_count; ++i) {
                struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
                nk_draw_list_path_line_to(&ctx->draw_list, pnt);
            }
            nk_draw_list_path_fill(&ctx->draw_list, p->color);
        } break;
        case NK_COMMAND_POLYLINE: {
            int i;
            const struct nk_command_polyline *p = (const struct nk_command_polyline*)cmd;
            for (i = 0; i < p->point_count; ++i) {
                struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
                nk_draw_list_path_line_to(&ctx->draw_list, pnt);
            }
            nk_draw_list_path_stroke(&ctx->draw_list, p->color, NK_STROKE_OPEN, p->line_thickness);
        } break;
        case NK_COMMAND_TEXT: {
            const struct nk_command_text *t = (const struct nk_command_text*)cmd;
            nk_draw_list_add_text(&ctx->draw_list, t->font, nk_rect(t->x, t->y, t->w, t->h),
                t->string, t->length, t->height, t->foreground);
        } break;
        case NK_COMMAND_IMAGE: {
            const struct nk_command_image *i = (const struct nk_command_image*)cmd;
            nk_draw_list_add_image(&ctx->draw_list, i->img, nk_rect(i->x, i->y, i->w, i->h), i->col);
        } break;
        case NK_COMMAND_CUSTOM: {
            const struct nk_command_custom *c = (const struct nk_command_custom*)cmd;
            c->callback(&ctx->draw_list, c->x, c->y, c->w, c->h, c->callback_data);
        } break;
        default: break;
        }
    }
    res |= (cmds->needed > cmds->allocated + (cmds->memory.size - cmds->size)) ? NK_CONVERT_COMMAND_BUFFER_FULL: 0;
    res |= (vertices->needed > vertices->allocated) ? NK_CONVERT_VERTEX_BUFFER_FULL: 0;
    res |= (elements->needed > elements->allocated) ? NK_CONVERT_ELEMENT_BUFFER_FULL: 0;
    return res;
}